

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbaReadVer.c
# Opt level: O2

int Prs_CreateFlopSetReset
              (Cba_Ntk_t *p,Prs_Ntk_t *pNtk,Vec_Int_t *vBox,int *pIndexSet,int *pIndexRst,
              int *pBitSet,int *pBitRst)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int local_5c;
  int local_58;
  int local_54;
  
  Cba_NtkCleanMap2(p);
  iVar2 = Cba_NtkStrId(p,"set");
  Cba_NtkSetMap2(p,iVar2,1);
  iVar2 = Cba_NtkStrId(p,"reset");
  Cba_NtkSetMap2(p,iVar2,2);
  iVar6 = -1;
  local_5c = -1;
  local_58 = local_5c;
  local_54 = local_5c;
  for (iVar2 = 1; iVar2 < vBox->nSize; iVar2 = iVar2 + 2) {
    iVar3 = Vec_IntEntry(vBox,iVar2 + -1);
    iVar4 = Vec_IntEntry(vBox,iVar2);
    iVar5 = Cba_NtkGetMap2(p,iVar3);
    iVar7 = iVar2;
    iVar1 = iVar4;
    if ((iVar5 != 1) &&
       (iVar3 = Cba_NtkGetMap2(p,iVar3), iVar7 = local_58, iVar1 = local_54, iVar3 == 2)) {
      local_5c = iVar2;
      iVar6 = iVar4;
    }
    local_54 = iVar1;
    local_58 = iVar7;
  }
  if ((-1 < local_54) && (-1 < iVar6)) {
    if (pIndexSet != (int *)0x0) {
      *pBitSet = 0;
    }
    if (pIndexRst != (int *)0x0) {
      *pBitRst = 0;
    }
    if (pBitSet != (int *)0x0) {
      *pBitSet = 0;
    }
    if (pBitRst != (int *)0x0) {
      *pBitRst = 0;
    }
    iVar2 = Prs_CreateBitSignal(pNtk,local_54);
    iVar6 = Prs_CreateBitSignal(pNtk,iVar6);
    iVar7 = 0;
    if ((iVar2 != -1) && (iVar6 != -1)) {
      if (pIndexSet != (int *)0x0) {
        *pIndexSet = local_58;
      }
      if (pIndexRst != (int *)0x0) {
        *pIndexRst = local_5c;
      }
      if (pBitSet != (int *)0x0) {
        *pBitSet = iVar2;
      }
      iVar7 = 1;
      if (pBitRst != (int *)0x0) {
        *pBitRst = iVar6;
      }
    }
    return iVar7;
  }
  __assert_fail("iSigSet >= 0 && iSigRst >= 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/cba/cbaReadVer.c"
                ,0x6a5,
                "int Prs_CreateFlopSetReset(Cba_Ntk_t *, Prs_Ntk_t *, Vec_Int_t *, int *, int *, int *, int *)"
               );
}

Assistant:

int Prs_CreateFlopSetReset( Cba_Ntk_t * p, Prs_Ntk_t * pNtk, Vec_Int_t * vBox, int * pIndexSet, int * pIndexRst, int * pBitSet, int * pBitRst )
{
    int iSigSet = -1, iSigRst = -1;
    int IndexSet = -1, IndexRst = -1;
    int FormId, ActId, k;
    // mark set and reset
    Cba_NtkCleanMap2( p );
    Cba_NtkSetMap2( p, Cba_NtkStrId(p, "set"), 1 );
    Cba_NtkSetMap2( p, Cba_NtkStrId(p, "reset"), 2 );
    // check the inputs
    Vec_IntForEachEntryDouble( vBox, FormId, ActId, k )
        if ( Cba_NtkGetMap2(p, FormId) == 1 ) // set
            iSigSet = ActId, IndexSet = k+1;
        else if ( Cba_NtkGetMap2(p, FormId) == 2 ) // reset
            iSigRst = ActId, IndexRst = k+1;
    assert( iSigSet >= 0 && iSigRst >= 0 );
    if ( pIndexSet ) *pBitSet = 0;
    if ( pIndexRst ) *pBitRst = 0;
    if ( pBitSet )   *pBitSet = 0;
    if ( pBitRst )   *pBitRst = 0;
    if ( iSigSet == -1 || iSigRst == -1 )
        return 0;
    iSigSet = Prs_CreateBitSignal(pNtk, iSigSet);
    iSigRst = Prs_CreateBitSignal(pNtk, iSigRst);
    if ( iSigSet == -1 || iSigRst == -1 )
        return 0;
    if ( pIndexSet ) *pIndexSet = IndexSet;
    if ( pIndexRst ) *pIndexRst = IndexRst;
    if ( pBitSet )   *pBitSet = iSigSet;
    if ( pBitRst )   *pBitRst = iSigRst;
    return 1;
}